

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InternalClose(ScriptContext *this)

{
  uint *puVar1;
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  uint uVar2;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Type pcVar4;
  long *plVar5;
  FunctionBody *this_01;
  ProbeContainer *this_02;
  Type pSVar6;
  JavascriptLibrary *this_03;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar10;
  ScriptContext *pSVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  Type buffer;
  NativeCodeGenerator *nativeCodeGen;
  int iVar17;
  AutoCriticalSection local_38;
  AutoCriticalSection autocs;
  
  this->isScriptContextActuallyClosed = true;
  puVar1 = &this->threadContext->closedScriptContextCount;
  *puVar1 = *puVar1 + 1;
  if (DAT_01459484 == '\x01') {
    Output::Print(L"MemoryTrace: ScriptContext Close\n");
    Output::Flush();
  }
  if (this->TTDWellKnownInfo != (RuntimeContextInfo *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::RuntimeContextInfo>
              (&Memory::HeapAllocator::Instance,this->TTDWellKnownInfo);
    this->TTDWellKnownInfo = (RuntimeContextInfo *)0x0;
  }
  if (this->TTDContextInfo != (ScriptContextTTD *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ScriptContextTTD>
              (&Memory::HeapAllocator::Instance,this->TTDContextInfo);
    this->TTDContextInfo = (ScriptContextTTD *)0x0;
  }
  nativeCodeGen = this->nativeCodeGen;
  if (nativeCodeGen != (NativeCodeGenerator *)0x0) {
    if ((this->isInitialized == true) &&
       ((this->super_ScriptContextBase).globalObject == (GlobalObject *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x289,"(!isInitialized || this->globalObject != nullptr)",
                                  "!isInitialized || this->globalObject != nullptr");
      if (!bVar8) goto LAB_006e95bb;
      *puVar9 = 0;
      nativeCodeGen = this->nativeCodeGen;
    }
    CloseNativeCodeGenerator(nativeCodeGen);
  }
  local_38.cs = &this->threadContext->csFunctionBody;
  CCLock::Enter(&(local_38.cs)->super_CCLock);
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = &this->sourceList;
    pLVar10 = Memory::
              RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
              ::operator->(this_00);
    uVar2 = (pLVar10->
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
            ).count;
    uVar15 = 0;
    uVar13 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar13 = uVar15;
    }
    for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      pRVar3 = (pLVar10->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[uVar16].ptr;
      if (((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
        pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef;
        if (pcVar4 != (Type)0x0) {
          lVar14 = *(long *)(pcVar4 + 0x18);
          if (lVar14 == 0) {
            uVar15 = 0;
            goto LAB_006e91d2;
          }
          uVar15 = (ulong)(0 < *(int *)(lVar14 + 0x20) - *(int *)(lVar14 + 0x28));
        }
        if (uVar15 != 0) break;
      }
LAB_006e91d2:
    }
    if ((uVar15 != 0) &&
       (this_00->ptr !=
        (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
         *)0x0)) {
      pLVar10 = Memory::
                RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                ::operator->(this_00);
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (lVar14 = 0;
          lVar14 < (pLVar10->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).count; lVar14 = lVar14 + 1) {
        pRVar3 = (pLVar10->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar14].ptr;
        if (((((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0
             ) && (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0
                  )) && (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) {
          for (uVar13 = 0; uVar13 < *(uint *)((long)plVar5 + 0x1c); uVar13 = uVar13 + 1) {
            iVar17 = *(int *)(*plVar5 + uVar13 * 4);
            if (iVar17 != -1) {
              while (iVar17 != -1) {
                lVar12 = (long)iVar17;
                iVar17 = *(int *)(plVar5[1] + 8 + lVar12 * 0x10);
                this_01 = *(FunctionBody **)(plVar5[1] + lVar12 * 0x10);
                if (this_01 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar9 = 1;
                  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar8) goto LAB_006e95bb;
                  *puVar9 = 0;
                }
                pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
                if ((pSVar11 != (ScriptContext *)0x0) &&
                   (pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01),
                   pSVar11 != this)) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar9 = 1;
                  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                              ,0x2b8,
                                              "(functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this)"
                                              ,
                                              "functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this"
                                             );
                  if (!bVar8) goto LAB_006e95bb;
                  *puVar9 = 0;
                }
                FunctionBody::Cleanup(this_01,true);
              }
            }
          }
        }
      }
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_38);
  ThreadContext::SubSourceSize(this->threadContext,this->sourceSize);
  if (this->interpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->interpreterThunkEmitter);
  }
  if (this->asmJsInterpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    InterpreterThunkEmitter::Close(this->asmJsInterpreterThunkEmitter);
  }
  if (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0) {
    JITManager::CloseScriptContext
              ((JITManager *)&JITManager::s_jitManager,this->m_remoteScriptContextAddr);
  }
  EnsureClearDebugDocument(this);
  if (this->debugContext != (DebugContext *)0x0) {
    this_02 = this->debugContext->diagProbesContainer;
    if (this_02 != (ProbeContainer *)0x0) {
      ProbeContainer::UninstallInlineBreakpointProbe(this_02,(HaltCallback *)0x0);
      ProbeContainer::UninstallDebuggerScriptOptionCallback(this->debugContext->diagProbesContainer)
      ;
    }
    local_38.cs = &this->debugContextCloseCS;
    CCLock::Enter(&(local_38.cs)->super_CCLock);
    DebugContext::Close(this->debugContext);
    AutoCriticalSection::~AutoCriticalSection(&local_38);
  }
  if (this->diagnosticArena != (ArenaAllocator *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&Memory::HeapAllocator::Instance,this->diagnosticArena);
    this->diagnosticArena = (ArenaAllocator *)0x0;
  }
  bVar8 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (bVar8) {
    if (this->isProfilerCreated == true) {
      ProfilePrint(this);
    }
    if (this->profiler != (ScriptContextProfiler *)0x0) {
      ScriptContextProfiler::Release(this->profiler);
      this->profiler = (ScriptContextProfiler *)0x0;
    }
  }
  if (this->referencesSharedDynamicSourceContextInfo == true) {
    if ((((this->super_ScriptContextBase).javascriptLibrary)->cache).dynamicSourceContextInfoMap.ptr
        == (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x310,"(this->GetDynamicSourceContextInfoMap() != nullptr)",
                                  "this->GetDynamicSourceContextInfoMap() != nullptr");
      if (!bVar8) {
LAB_006e95bb:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar9 = 0;
    }
    ThreadContext::ReleaseSourceDynamicProfileManagers(this->threadContext,this->url);
  }
  if (this->interpreterArena != (ArenaAllocator *)0x0) {
    ReleaseInterpreterArena(this);
    this->interpreterArena = (ArenaAllocator *)0x0;
  }
  this->builtInLibraryFunctions = (BuiltInLibraryFunctionMap *)0x0;
  (this->super_ScriptContextBase).pActiveScriptDirect = (IActiveScriptDirect *)0x0;
  this->isWeakReferenceDictionaryListCleared = true;
  buffer = (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)buffer
         != &this->weakReferenceDictionaryList) {
    pSVar6 = buffer->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&(this->generalAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,0x10
              );
    buffer = pSVar6;
  }
  (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->weakReferenceDictionaryList).super_RealCount.count = 0;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Clear
            (&this->noSpecialPropertyRegistry,false);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
            (&this->onlyWritablePropertyRegistry,false);
  ThreadContext::ReleaseDebugManager(this->threadContext);
  this_03 = (this->super_ScriptContextBase).javascriptLibrary;
  if (this_03 != (JavascriptLibrary *)0x0) {
    JavascriptLibrary::CleanupForClose(this_03);
    JavascriptLibrary::Uninitialize((this->super_ScriptContextBase).javascriptLibrary);
    ClearScriptContextCaches(this);
  }
  return;
}

Assistant:

void ScriptContext::InternalClose()
    {
        isScriptContextActuallyClosed = true;
        this->GetThreadContext()->closedScriptContextCount++;

        PERF_COUNTER_DEC(Basic, ScriptContextActive);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: ScriptContext Close\n"));
            Output::Flush();
        }
#endif
        JS_ETW_INTERNAL(EventWriteJSCRIPT_HOST_SCRIPT_CONTEXT_CLOSE(this));

#if ENABLE_TTD
        if(this->TTDWellKnownInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::RuntimeContextInfo, this->TTDWellKnownInfo);
            this->TTDWellKnownInfo = nullptr;
        }

        if(this->TTDContextInfo != nullptr)
        {
            TT_HEAP_DELETE(TTD::ScriptContextTTD, this->TTDContextInfo);
            this->TTDContextInfo = nullptr;
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (nativeCodeGen != nullptr)
        {
            Assert(!isInitialized || this->globalObject != nullptr);
            CloseNativeCodeGenerator(this->nativeCodeGen);
        }
#endif
        {
            // Take lock on the function bodies to sync with the etw source rundown if any.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            if (this->sourceList)
            {
                bool hasFunctions = false;
                this->sourceList->MapUntil([&hasFunctions](int, RecyclerWeakReference<Utf8SourceInfo>* sourceInfoWeakRef) -> bool
                {
                    Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();
                    if (sourceInfo)
                    {
                        hasFunctions = sourceInfo->HasFunctions();
                    }

                    return hasFunctions;
                });

                if (hasFunctions)
                {
#if ENABLE_NATIVE_CODEGEN
#if PDATA_ENABLED && defined(_WIN32)
                    struct AutoReset
                    {
                        AutoReset(ThreadContext* threadContext)
                            :threadContext(threadContext)
                        {
                            // indicate background thread that we need help to delete the xData
                            threadContext->GetJobProcessor()->StartExtraWork();
                        }
                        ~AutoReset()
                        {
                            threadContext->GetJobProcessor()->EndExtraWork();
                        }

                        ThreadContext* threadContext;
                    } autoReset(this->GetThreadContext());
#endif
#endif

                    // We still need to walk through all the function bodies and call cleanup
                    // because otherwise ETW events might not get fired if a GC doesn't happen
                    // and the thread context isn't shut down cleanly (process detach case)
                    this->MapFunction([this](Js::FunctionBody* functionBody) {
                        Assert(functionBody->GetScriptContext() == nullptr || functionBody->GetScriptContext() == this);
                        functionBody->Cleanup(/* isScriptContextClosing */ true);
                    });
                }
            }
        }

        this->GetThreadContext()->SubSourceSize(this->GetSourceSize());

#if DYNAMIC_INTERPRETER_THUNK
        if (this->interpreterThunkEmitter != nullptr)
        {
            this->interpreterThunkEmitter->Close();
        }
#endif

#ifdef ASMJS_PLAT
        if (this->asmJsInterpreterThunkEmitter != nullptr)
        {
            this->asmJsInterpreterThunkEmitter->Close();
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (m_remoteScriptContextAddr)
        {
            JITManager::GetJITManager()->CloseScriptContext(m_remoteScriptContextAddr);
        }
#endif

#ifdef ENABLE_SCRIPT_PROFILING
        // Stop profiling if present
        DeRegisterProfileProbe(S_OK, nullptr);
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->EnsureClearDebugDocument();

        if (this->debugContext != nullptr)
        {
            if (this->debugContext->GetProbeContainer() != nullptr)
            {
                this->debugContext->GetProbeContainer()->UninstallInlineBreakpointProbe(nullptr);
                this->debugContext->GetProbeContainer()->UninstallDebuggerScriptOptionCallback();
            }

            // Guard the closing DebugContext as in meantime PDM might call OnBreakFlagChange
            AutoCriticalSection autoDebugContextCloseCS(&debugContextCloseCS);
            this->debugContext->Close();
            // Not deleting debugContext here as Close above will clear all memory debugContext allocated.
            // Actual deletion of debugContext will happen in ScriptContext destructor
        }

        if (this->diagnosticArena != nullptr)
        {
            HeapDelete(this->diagnosticArena);
            this->diagnosticArena = nullptr;
        }
#endif

        // Need to print this out before the native code gen is deleted
        // which will delete the codegenProfiler

#ifdef PROFILE_EXEC
        if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
        {
            if (isProfilerCreated)
            {
                this->ProfilePrint();
            }

            if (profiler != nullptr)
            {
                profiler->Release();
                profiler = nullptr;
            }
        }
#endif


#if ENABLE_PROFILE_INFO
        // Release this only after native code gen is shut down, as there may be
        // profile info allocated from the SourceDynamicProfileManager arena.
        // The first condition might not be true if the dynamic functions have already been freed by the time
        // ScriptContext closes
        if (referencesSharedDynamicSourceContextInfo)
        {
            // For the host provided dynamic code, we may not have added any dynamic context to the dynamicSourceContextInfoMap
            Assert(this->GetDynamicSourceContextInfoMap() != nullptr);
            this->GetThreadContext()->ReleaseSourceDynamicProfileManagers(this->GetUrl());
        }
#endif

        RECYCLER_PERF_COUNTER_SUB(BindReference, bindReferenceCount);

        if (this->interpreterArena)
        {
            ReleaseInterpreterArena();
            interpreterArena = nullptr;
        }

        builtInLibraryFunctions = nullptr;

        pActiveScriptDirect = nullptr;

        isWeakReferenceDictionaryListCleared = true;
        this->weakReferenceDictionaryList.Clear(this->GeneralAllocator());

        this->noSpecialPropertyRegistry.Clear(false /* isThreadClear */);
        this->onlyWritablePropertyRegistry.Clear(false /* isThreadClear */);

#ifdef ENABLE_SCRIPT_DEBUGGING
        threadContext->ReleaseDebugManager();
#endif

        // This can be null if the script context initialization threw
        // and InternalClose gets called in the destructor code path
        if (javascriptLibrary != nullptr)
        {
            javascriptLibrary->CleanupForClose();
            javascriptLibrary->Uninitialize();

            this->ClearScriptContextCaches();
        }
    }